

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O2

u32string * __thiscall
QString::toStdU32String_abi_cxx11_(u32string *__return_storage_ptr__,QString *this)

{
  size_type sVar1;
  char16_t *uc;
  
  *(undefined1 **)((long)&__return_storage_ptr__->field_2 + 8) = &DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->_M_string_length = (size_type)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = (size_type)&DAT_aaaaaaaaaaaaaaaa;
  sVar1 = (this->d).size;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  _M_construct(__return_storage_ptr__,sVar1,L'\0');
  uc = (this->d).ptr;
  if (uc == (char16_t *)0x0) {
    uc = L"";
  }
  sVar1 = toUcs4_helper(uc,(this->d).size,(__return_storage_ptr__->_M_dataplus)._M_p);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  resize(__return_storage_ptr__,sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::u32string QString::toStdU32String() const
{
    std::u32string u32str(size(), char32_t(0));
    const qsizetype len = toUcs4_helper(reinterpret_cast<const char16_t *>(data()),
                                        size(), u32str.data());
    u32str.resize(len);
    return u32str;
}